

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O3

bool extractLine(string *line,string *text,int width,bool hyphenate,uint *offset)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  pointer pcVar4;
  wchar_t ucs;
  int iVar5;
  long *plVar6;
  undefined7 in_register_00000009;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  size_type bytes;
  ulong local_80;
  undefined4 local_74;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  uVar8 = (ulong)*offset;
  uVar3 = text->_M_string_length;
  if (uVar8 < uVar3) {
    local_74 = (undefined4)CONCAT71(in_register_00000009,hyphenate);
    iVar12 = 0;
    uVar11 = 0;
    uVar10 = uVar8;
    local_80 = uVar8;
    do {
      do {
        uVar9 = uVar10;
        uVar10 = local_80;
        ucs = utf8_next_char(text,&local_80);
        if (ucs == L' ') {
          uVar11 = uVar10 & 0xffffffff;
        }
        else if ((ucs == L'\n') || (ucs == L'\0')) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
          std::__cxx11::string::operator=((string *)line,(string *)&local_70);
          if (local_70 != &local_60) {
            operator_delete(local_70);
          }
          uVar10 = local_80 & 0xffffffff;
          goto LAB_0013cade;
        }
        iVar5 = mk_wcwidth(ucs);
        iVar12 = iVar12 + iVar5;
      } while (iVar12 <= width);
      pcVar4 = (text->_M_dataplus)._M_p;
      cVar1 = pcVar4[uVar9];
      cVar2 = pcVar4[uVar10];
      if ((cVar1 != ' ') && (cVar2 == ' ')) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
        std::__cxx11::string::operator=((string *)line,(string *)&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        uVar10 = (ulong)((int)uVar10 + 1);
        goto LAB_0013cade;
      }
      iVar5 = (int)uVar11;
      if (((cVar1 == ' ') && (cVar2 != ' ')) && (iVar5 != 0)) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
        std::__cxx11::string::operator=((string *)line,(string *)&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        goto LAB_0013cade;
      }
    } while ((cVar1 == ' ') || (cVar2 == ' '));
    if (iVar5 == 0) {
      if ((char)local_74 == '\0') {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
        std::__cxx11::string::operator=((string *)line,(string *)&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
      }
      else {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)text);
        plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_60 = *plVar7;
          lStack_58 = plVar6[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar7;
          local_70 = (long *)*plVar6;
        }
        local_68 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)line,(string *)&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        uVar10 = uVar9;
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
      }
      uVar10 = uVar10 & 0xffffffff;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
      std::__cxx11::string::operator=((string *)line,(string *)&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      uVar10 = (ulong)(iVar5 + 1);
    }
LAB_0013cade:
    *offset = (uint)uVar10;
  }
  return uVar8 < uVar3;
}

Assistant:

bool extractLine (
  std::string& line,
  const std::string& text,
  int width,
  bool hyphenate,
  unsigned int& offset)
{
  // Terminate processing.
  // Note: bytes vs bytes.
  if (offset >= text.length ())
    return false;

  std::string::size_type last_last_bytes = offset;
  std::string::size_type last_bytes = offset;
  std::string::size_type bytes = offset;
  unsigned int last_ws = 0;
  int character;
  int char_width = 0;
  int line_width = 0;
  while (1)
  {
    last_last_bytes = last_bytes;
    last_bytes = bytes;
    character = utf8_next_char (text, bytes);

    if (character == 0 ||
        character == '\n')
    {
      line = text.substr (offset, last_bytes - offset);
      offset = bytes;
      break;
    }
    else if (character == ' ')
      last_ws = last_bytes;

    char_width = mk_wcwidth (character);
    if (line_width + char_width > width)
    {
      int last_last_character = text[last_last_bytes];
      int last_character = text[last_bytes];

      // [case 1] one| two --> last_last != 32, last == 32, ws == 0
      if (last_last_character != ' ' &&
          last_character      == ' ')
      {
        line = text.substr (offset, last_bytes - offset);
        offset = last_bytes + 1;
        break;
      }

      // [case 2] one |two --> last_last == 32, last != 32, ws != 0
      else if (last_last_character == ' ' &&
               last_character      != ' ' &&
               last_ws             != 0)
      {
        line = text.substr (offset, last_bytes - offset - 1);
        offset = last_bytes;
        break;
      }

      else if (last_last_character != ' ' &&
               last_character      != ' ')
      {
        // [case 3] one t|wo --> last_last != 32, last != 32, ws != 0
        if (last_ws != 0)
        {
          line = text.substr (offset, last_ws - offset);
          offset = last_ws + 1;
          break;
        }
        // [case 4] on|e two --> last_last != 32, last != 32, ws == 0
        else
        {
          if (hyphenate)
          {
            line = text.substr (offset, last_bytes - offset - 1) + '-';
            offset = last_last_bytes;
          }
          else
          {
            line = text.substr (offset, last_bytes - offset);
            offset = last_bytes;
          }
        }

        break;
      }
    }

    line_width += char_width;
  }

  return true;
}